

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeFabricEdgeGetVerticesExpPrologue
          (ZEParameterValidation *this,ze_fabric_edge_handle_t hEdge,
          ze_fabric_vertex_handle_t *phVertexA,ze_fabric_vertex_handle_t *phVertexB)

{
  ze_result_t zVar1;
  
  if (hEdge == (ze_fabric_edge_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (phVertexA != (ze_fabric_vertex_handle_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (phVertexB != (ze_fabric_vertex_handle_t *)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeFabricEdgeGetVerticesExpPrologue(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        if( nullptr == hEdge )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phVertexA )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phVertexB )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }